

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::
Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doEvaluate(IVal *__return_storage_ptr__,
            Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *this,EvalContext *ctx)

{
  ApplyFunc *pAVar1;
  Expr<tcu::Matrix<float,_3,_3>_> *pEVar2;
  Expr<deqp::gls::BuiltinPrecisionTests::Void> *pEVar3;
  undefined1 local_202;
  undefined1 local_201;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 local_1e0 [216];
  undefined1 local_108 [216];
  
  pAVar1 = this->m_func;
  (*(((this->m_args).a.super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
      super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_3,_3>_>_>.
     m_ptr)->super_ExprBase)._vptr_ExprBase[4])(local_108);
  pEVar2 = (this->m_args).b.super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
           super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_3,_3>_>_>
           .m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(local_1e0,pEVar2,ctx);
  pEVar3 = (this->m_args).c.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           .m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(pEVar3,ctx);
  pEVar3 = (this->m_args).d.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           .m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(pEVar3,ctx);
  local_1f0 = &local_201;
  local_1e8 = &local_202;
  local_200 = local_108;
  local_1f8 = local_1e0;
  (**(code **)(*(long *)pAVar1 + 0x40))(__return_storage_ptr__,pAVar1,ctx);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		return m_func.apply(ctx,
							m_args.a->evaluate(ctx), m_args.b->evaluate(ctx),
							m_args.c->evaluate(ctx), m_args.d->evaluate(ctx));
	}